

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto.c
# Opt level: O0

google_protobuf_OneofDescriptorProto * oneofdef_toproto(upb_ToProto_Context *ctx,upb_OneofDef *o)

{
  upb_OneofDef *ctx_00;
  _Bool _Var1;
  google_protobuf_OneofDescriptorProto *msg;
  char *pcVar2;
  google_protobuf_OneofOptions *pgVar3;
  google_protobuf_OneofOptions *dst;
  char *pb;
  size_t size;
  google_protobuf_OneofDescriptorProto *local_20;
  google_protobuf_OneofDescriptorProto *proto;
  upb_OneofDef *o_local;
  upb_ToProto_Context *ctx_local;
  
  proto = (google_protobuf_OneofDescriptorProto *)o;
  o_local = (upb_OneofDef *)ctx;
  msg = google_protobuf_OneofDescriptorProto_new(ctx->arena);
  ctx_00 = o_local;
  local_20 = msg;
  if (msg == (google_protobuf_OneofDescriptorProto *)0x0) {
    longjmp((__jmp_buf_tag *)&o_local->resolved_features,1);
  }
  pcVar2 = upb_OneofDef_Name((upb_OneofDef *)proto);
  _size = strviewdup((upb_ToProto_Context *)ctx_00,pcVar2);
  google_protobuf_OneofDescriptorProto_set_name(msg,_size);
  _Var1 = upb_OneofDef_HasOptions((upb_OneofDef *)proto);
  if (_Var1) {
    pgVar3 = upb_OneofDef_Options((upb_OneofDef *)proto);
    pcVar2 = google_protobuf_OneofOptions_serialize(pgVar3,(upb_Arena *)o_local->opts,(size_t *)&pb)
    ;
    if (pcVar2 == (char *)0x0) {
      longjmp((__jmp_buf_tag *)&o_local->resolved_features,1);
    }
    pgVar3 = google_protobuf_OneofOptions_parse(pcVar2,(size_t)pb,(upb_Arena *)o_local->opts);
    if (pgVar3 == (google_protobuf_OneofOptions *)0x0) {
      longjmp((__jmp_buf_tag *)&o_local->resolved_features,1);
    }
    google_protobuf_OneofDescriptorProto_set_options(local_20,pgVar3);
  }
  return local_20;
}

Assistant:

static google_protobuf_OneofDescriptorProto* oneofdef_toproto(upb_ToProto_Context* ctx,
                                                     const upb_OneofDef* o) {
  google_protobuf_OneofDescriptorProto* proto =
      google_protobuf_OneofDescriptorProto_new(ctx->arena);
  CHK_OOM(proto);

  google_protobuf_OneofDescriptorProto_set_name(proto,
                                       strviewdup(ctx, upb_OneofDef_Name(o)));

  if (upb_OneofDef_HasOptions(o)) {
    SET_OPTIONS(proto, OneofDescriptorProto, OneofOptions,
                upb_OneofDef_Options(o));
  }

  return proto;
}